

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecPeformDec2(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Sfm_Par_t *pSVar1;
  Vec_Int_t *vCut;
  int w;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int extraout_EDX;
  int nBits;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  word (*pTruth) [4];
  int iVar9;
  word *pwVar10;
  bool bVar11;
  undefined8 uVar12;
  uint local_122c;
  uint local_1228;
  uint local_1224;
  int iLibObj;
  int (*local_1210) [16];
  Vec_Int_t *local_1208;
  Vec_Int_t *local_1200;
  Vec_Int_t *local_11f8;
  ulong local_11f0;
  int nSupp [4];
  word uTruth [4] [4];
  word Masks [2] [8];
  int pSupp [4] [16];
  int pAssump [1000];
  
  pSVar1 = p->pPars;
  bVar11 = true;
  if (pSVar1->fPrintDecs == 0) {
    bVar11 = pSVar1->fVeryVerbose != 0;
  }
  uVar4 = pSVar1->nDecMax;
  uVar7 = 1;
  if (1 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  if (pSVar1->fArea != 1) {
    __assert_fail("p->pPars->fArea == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x454,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  if (bVar11) {
    printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
    uVar4 = p->pPars->nDecMax;
  }
  if (4 < (int)uVar4) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                  ,0x459,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  local_11f8 = &p->vObjDec;
  local_1200 = &p->vObjMap;
  local_1208 = &p->vGateCut;
  pwVar10 = uTruth[0];
  uVar8 = 0;
  iVar2 = 0;
  local_122c = 0xffffffff;
  uVar12 = extraout_RDX;
  local_1228 = local_122c;
  local_1224 = local_122c;
  local_11f0 = uVar7;
  do {
    iVar3 = (int)uVar12;
    if (uVar8 == local_11f0) {
      Sfm_ObjSetdownSimInfo(pObj);
      if (local_1228 == 0xffffffff) {
        if (bVar11) {
          puts("Best  : NO DEC.");
        }
        piVar6 = &p->nNoDecs;
        iVar2 = -2;
      }
      else {
        lVar5 = (long)(int)local_1228;
        if (bVar11) {
          uVar4 = nSupp[lVar5];
          printf("Best %d: %d  ",(ulong)local_1228,(ulong)uVar4);
          Dau_DsdPrintFromTruth(uTruth[lVar5],uVar4);
        }
        if ((int)local_122c < 0) {
          __assert_fail("iLibObjBest >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4ad,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        iVar2 = nSupp[lVar5];
        iVar3 = Sfm_LibImplementGatesArea
                          (p->pLib,pSupp[lVar5],iVar2,local_122c,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar2) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4af,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar2] = p->nLuckySizes[iVar2] + 1;
        iVar2 = 1;
        if (2 < iVar3) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                        ,0x4b1,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
        }
LAB_00445a47:
        piVar6 = p->nLuckyGates + iVar3;
      }
      *piVar6 = *piVar6 + 1;
      return iVar2;
    }
    iVar9 = (p->vObjDec).nSize;
    if (iVar2 < iVar9) {
      Vec_IntShrink(local_11f8,iVar2);
      iVar9 = (p->vObjDec).nSize;
      iVar3 = extraout_EDX;
    }
    Abc_TtMask(Masks[0],p->nPats[0],iVar3);
    Abc_TtMask(Masks[1],p->nPats[1],nBits);
    pTruth = uTruth + uVar8;
    local_1210 = pSupp + uVar8;
    uVar12 = 0;
    iVar2 = Sfm_DecPeformDec_rec(p,*pTruth,*local_1210,pAssump,0,Masks,1,0);
    nSupp[uVar8] = iVar2;
    if (iVar2 != -2) {
      if (bVar11) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar8 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar2);
      }
      p->nSuppVars = iVar2;
      if (1 < iVar2) {
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          p->Copy[lVar5] = pwVar10[lVar5];
        }
        iVar3 = Sfm_LibFindAreaMatch(p->pLib,*pTruth,iVar2,&iLibObj);
        vCut = local_1208;
        uVar12 = extraout_RDX_01;
        if (iVar3 != -1) {
          Sfm_DecPrepareVec(local_1200,*local_1210,iVar2,local_1208);
          iVar2 = Sfm_DecMffcAreaReal(pObj,vCut,(Vec_Int_t *)0x0);
          if (iVar2 < p->AreaMffc) {
            __assert_fail("p->AreaMffc <= AreaThis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                          ,0x492,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
          }
          uVar12 = extraout_RDX_02;
          if (p->pPars->fZeroCost == 0) {
            if (iVar3 < iVar2) goto LAB_00445906;
          }
          else if (iVar3 <= iVar2) {
LAB_00445906:
            uVar4 = iVar2 - iVar3;
            if ((int)uVar4 < 0) {
              __assert_fail("GainThis >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                            ,0x497,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
            }
            if ((int)local_1224 < (int)uVar4) {
              local_122c = iLibObj;
              local_1228 = (uint)uVar8;
              local_1224 = uVar4;
            }
          }
        }
        goto LAB_00445925;
      }
      for (lVar5 = 0x7c; lVar5 != 0x80; lVar5 = lVar5 + 1) {
        *(word *)(p->GateAnd + lVar5 * 2 + -0x1e) = *pwVar10;
        pwVar10 = pwVar10 + 1;
      }
      iVar3 = Sfm_LibImplementSimple(p->pLib,*pTruth,*local_1210,iVar2,&p->vObjGates,&p->vObjFanins)
      ;
      if (p->pPars->nVarMax < iVar2) {
        __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x475,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      p->nLuckySizes[iVar2] = p->nLuckySizes[iVar2] + 1;
      iVar2 = iVar3;
      if (2 < iVar3) {
        __assert_fail("RetValue <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                      ,0x477,"int Sfm_DecPeformDec2(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      goto LAB_00445a47;
    }
    if (bVar11) {
      printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar8 & 0xffffffff,
             (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      uVar12 = extraout_RDX_00;
    }
LAB_00445925:
    iVar2 = iVar9 + 1;
    uVar8 = uVar8 + 1;
    pwVar10 = pwVar10 + 4;
  } while( true );
}

Assistant:

int Sfm_DecPeformDec2( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    //int fNeedInv, AreaGainInv = Sfm_DecComputeFlipInvGain(p, pObj, &fNeedInv);
    int i, RetValue, Prev = 0, iBest = -1, AreaThis, AreaNew;//, AreaNewInv;
    int GainThis, GainBest = -1, iLibObj, iLibObjBest = -1; 
    assert( p->pPars->fArea == 1 );
//printf( "AreaGainInv = %8.2f  ", Scl_Int2Flt(AreaGainInv) );
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            //printf( "\n" );
            return RetValue;
        }

        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        AreaNew = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], &iLibObj );
/*
        uTruth[i][0] = ~uTruth[i][0];
        AreaNewInv = Sfm_LibFindAreaMatch( p->pLib, uTruth[i], nSupp[i], NULL );
        uTruth[i][0] = ~uTruth[i][0];

        if ( AreaNew > 0 && AreaNewInv > 0 && AreaNew - AreaNewInv + AreaGainInv > 0 )
            printf( "AreaNew = %8.2f   AreaNewInv = %8.2f   Gain = %8.2f   Total = %8.2f\n", 
                Scl_Int2Flt(AreaNew), Scl_Int2Flt(AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv), Scl_Int2Flt(AreaNew - AreaNewInv + AreaGainInv) );
        else
            printf( "\n" );
*/
        if ( AreaNew == -1 )
            continue;


        // compute area savings
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut );
        AreaThis = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, NULL);
        assert( p->AreaMffc <= AreaThis );
        if ( p->pPars->fZeroCost ? (AreaNew > AreaThis) : (AreaNew >= AreaThis) )
            continue;
        // find the best gain
        GainThis = AreaThis - AreaNew;
        assert( GainThis >= 0 );
        if ( GainBest < GainThis )
        {
            GainBest    = GainThis;
            iLibObjBest = iLibObj;
            iBest       = i;
        }
    }
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        //printf( "\n" );
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
    if ( fVeryVerbose )
      Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    // implement
    assert( iLibObjBest >= 0 );
    RetValue = Sfm_LibImplementGatesArea( p->pLib, pSupp[iBest], nSupp[iBest], iLibObjBest, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    return 1;
}